

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O1

int oonf_packet_send(oonf_packet_socket *pktsocket,netaddr_socket *remote,void *data,size_t length)

{
  uint32_t *puVar1;
  autobuf *paVar2;
  int iVar3;
  byte bVar4;
  oonf_log_source oVar5;
  uint uVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  int *piVar9;
  uint64_t uVar10;
  char *pcVar11;
  uint64_t uVar12;
  char *pcVar13;
  int __flags;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  netaddr_str buf;
  
  if ((pktsocket->out)._len == 0) {
    __flags = (uint)(pktsocket->config).dont_route << 2;
    iVar3 = (pktsocket->scheduler_entry).fd.fd;
    if (remote == (netaddr_socket *)0x0) {
      sVar7 = send(iVar3,data,length,__flags);
    }
    else {
      sVar7 = sendto(iVar3,data,length,__flags,(sockaddr *)&remote->v4,0x80);
    }
    if (0 < (int)sVar7) {
      uVar16 = (ulong)_oonf_packet_socket_subsystem.logging;
      if (((&log_global_mask)[uVar16] & 1) != 0) {
        uVar8 = netaddr_socket_to_string(&buf,remote);
        pcVar11 = "";
        if (pktsocket->os_if != (os_interface *)0x0) {
          pcVar11 = pktsocket->os_if->name;
        }
        oonf_log(1,uVar16,"src/base/oonf_packet_socket.c",0xe6,0,0,"Sent %d bytes to %s %s",sVar7,
                 uVar8,pcVar11);
      }
      puVar1 = &(pktsocket->scheduler_entry)._stat_send;
      *puVar1 = *puVar1 + 1;
      return 0;
    }
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    if ((iVar3 != 0xb) && (iVar3 != 4)) {
      if (iVar3 != 1) {
        uVar16 = (ulong)_oonf_packet_socket_subsystem.logging;
        if (((&log_global_mask)[uVar16] & 4) != 0) {
          uVar8 = netaddr_socket_to_string(&buf,remote);
          pcVar11 = strerror(*piVar9);
          oonf_log(4,uVar16,"src/base/oonf_packet_socket.c",0xf1,0,0,
                   "Cannot send UDP packet to %s: %s (%d)",uVar8,pcVar11,*piVar9);
          return -1;
        }
        return -1;
      }
      uVar12 = pktsocket->_errno1_measurement_time;
      uVar10 = oonf_clock_getNow();
      lVar17 = uVar12 - uVar10;
      uVar15 = pktsocket->_errno1_count;
      uVar6 = uVar15;
      if (lVar17 < -59999) {
        uVar6 = SUB164(ZEXT416(uVar15) /
                       (ZEXT816(0) * ZEXT816(0x45e7b272f608771) >> 0x45 &
                       (undefined1  [16])0x7ffffffffffffff),0);
      }
      pktsocket->_errno1_count = uVar15 + 1;
      if (((lVar17 < -59999) && (pktsocket->_errno1_suppression == true)) && (uVar6 < 5)) {
        pktsocket->_errno1_suppression = false;
        bVar4 = 0;
      }
      else {
        bVar4 = 0;
        if ((pktsocket->_errno1_suppression == false) && (10 < uVar6)) {
          pktsocket->_errno1_suppression = true;
          bVar4 = 1;
          uVar15 = 0;
        }
      }
      if (!(bool)(-60000 < lVar17 & (bVar4 ^ 1))) {
        uVar12 = oonf_clock_getNow();
        pktsocket->_errno1_measurement_time = uVar12;
        pktsocket->_errno1_count = 1;
      }
      oVar5 = _oonf_packet_socket_subsystem.logging;
      pcVar11 = "-";
      if (pktsocket->os_if != (os_interface *)0x0) {
        pcVar11 = pktsocket->os_if->name;
      }
      if ((uVar15 != 0 & pktsocket->_errno1_suppression) == 1) {
        if (1 < pktsocket->_errno1_count) {
          return -1;
        }
        if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
          return -1;
        }
        uVar8 = netaddr_socket_to_string(&buf,remote);
        pcVar13 = strerror(*piVar9);
        iVar3 = *piVar9;
        uVar14 = 0x1fb;
        pcVar18 = "Cannot send UDP packet to %s (%s): %s (%d) (%d similar errors suppressed)";
      }
      else {
        if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
          return -1;
        }
        uVar8 = netaddr_socket_to_string(&buf,remote);
        pcVar13 = strerror(*piVar9);
        iVar3 = *piVar9;
        uVar14 = 0x1ff;
        pcVar18 = "Cannot send UDP packet to %s (%s): %s (%d)";
      }
      oonf_log(4,oVar5,"src/base/oonf_packet_socket.c",uVar14,0,0,pcVar18,uVar8,pcVar11,pcVar13,
               iVar3);
      return -1;
    }
  }
  paVar2 = &pktsocket->out;
  abuf_memcpy(paVar2,remote,0x80);
  buf.buf._0_2_ = SUB82(length,0);
  abuf_memcpy(paVar2,&buf,2);
  abuf_memcpy(paVar2,data,length);
  oonf_socket_set_write(&pktsocket->scheduler_entry,true);
  return 0;
}

Assistant:

int
oonf_packet_send(struct oonf_packet_socket *pktsocket, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
  struct netaddr_str buf;

  if (abuf_getlen(&pktsocket->out) == 0) {
    /* no backlog of outgoing packets, try to send directly */
    result = os_fd_sendto(&pktsocket->scheduler_entry.fd, data, length, remote, pktsocket->config.dont_route);
    if (result > 0) {
      /* successful */
      OONF_DEBUG(LOG_PACKET, "Sent %d bytes to %s %s", result, netaddr_socket_to_string(&buf, remote),
        pktsocket->os_if != NULL ? pktsocket->os_if->name : "");
      oonf_socket_register_direct_send(&pktsocket->scheduler_entry);
      return 0;
    }

    if (errno == EPERM) {
      _handle_errno1(pktsocket, remote);
      return -1;
    }
    if (errno != EINTR && errno != EAGAIN && errno != EWOULDBLOCK) {
      OONF_WARN(LOG_PACKET, "Cannot send UDP packet to %s: %s (%d)", netaddr_socket_to_string(&buf, remote),
        strerror(errno), errno);
      return -1;
    }
  }

  /* append destination */
  abuf_memcpy(&pktsocket->out, remote, sizeof(*remote));

  /* append data length */
  abuf_append_uint16(&pktsocket->out, length);

  /* append data */
  abuf_memcpy(&pktsocket->out, data, length);

  /* activate outgoing socket scheduler */
  oonf_socket_set_write(&pktsocket->scheduler_entry, true);
  return 0;
}